

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArmParser.cpp
# Opt level: O1

bool __thiscall
ArmParser::parseArmParameters
          (ArmParser *this,Parser *parser,tArmOpcode *opcode,ArmOpcodeVariables *vars)

{
  char cVar1;
  char symbol;
  uint uVar2;
  bool bVar3;
  Token *pTVar4;
  uint uVar5;
  char *pcVar6;
  ulong uVar7;
  ArmParser *this_00;
  char *pcVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  ArmRegisterValue tempRegister;
  
  pcVar6 = opcode->mask;
  (vars->Shift).UseShift = false;
  (vars->Shift).UseFinal = false;
  vars->psr = false;
  vars->writeback = false;
  vars->SignPlus = false;
  (vars->Opcode).UseNewEncoding = false;
  (vars->Opcode).UseNewType = false;
  this_00 = this;
  do {
    cVar1 = *pcVar6;
    if (cVar1 == '\0') {
      pTVar4 = Tokenizer::nextToken
                         ((parser->entries).
                          super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>.
                          _M_impl.super__Vector_impl_data._M_finish[-1].tokenizer);
      return pTVar4->type == Separator;
    }
    uVar7 = (ulong)(cVar1 == '/');
    pcVar8 = pcVar6 + uVar7 + 1;
    symbol = pcVar8[-1];
    switch(symbol) {
    case 'D':
      bVar3 = parseRegisterTable(this_00,parser,&(vars->CopData).cd,armCopRegisters,0x10);
      break;
    case 'E':
    case 'F':
    case 'G':
    case 'H':
    case 'J':
    case 'K':
    case 'L':
    case 'O':
    case 'Q':
    case 'T':
    case 'U':
    case 'V':
      goto switchD_001618cc_caseD_45;
    case 'I':
switchD_001618cc_caseD_49:
      this_00 = this;
      bVar3 = parseImmediate(this,parser,&vars->ImmediateExpression);
      if (bVar3) {
        vars->ImmediateBitLen = 0x20;
        goto LAB_00161b9e;
      }
      goto LAB_00161a40;
    case 'M':
      bVar3 = parseRegisterTable(this_00,parser,&(vars->CopData).cm,armCopRegisters,0x10);
      break;
    case 'N':
      bVar3 = parseRegisterTable(this_00,parser,&(vars->CopData).cn,armCopRegisters,0x10);
      break;
    case 'P':
      bVar3 = parsePsrTransfer(this_00,parser,vars,*pcVar8 == '1');
      goto joined_r0x00161b99;
    case 'R':
      bVar3 = parseRegisterList(this_00,parser,&vars->rlist,0xffff);
      break;
    case 'S':
      this_00 = this;
      bVar3 = parseShift(this,parser,vars,*pcVar8 == '1');
      goto joined_r0x00161b99;
    case 'W':
      parseWriteback(this_00,parser,&vars->writeback);
      goto LAB_00161b9e;
    case 'X':
      bVar3 = parseRegisterTable(this_00,parser,&(vars->CopData).pn,armCopNumbers,0x10);
      break;
    case 'Y':
      this_00 = this;
      bVar3 = parseImmediate(this,parser,&(vars->CopData).CpopExpression);
      if (!bVar3) goto LAB_00161a40;
      vars->ImmediateBitLen = 4;
      goto LAB_00161b9e;
    case 'Z':
      this_00 = this;
      bVar3 = parseImmediate(this,parser,&(vars->CopData).CpinfExpression);
      if (!bVar3) goto LAB_00161a40;
      vars->ImmediateBitLen = 3;
      goto LAB_00161b9e;
    default:
      switch(symbol) {
      case 'i':
        goto switchD_001618cc_caseD_49;
      case 'j':
        this_00 = this;
        bVar3 = parseImmediate(this,parser,&vars->ImmediateExpression);
        if (!bVar3) goto LAB_00161a40;
        vars->ImmediateBitLen = (int)pcVar6[uVar7 + 1];
        goto LAB_00161b9b;
      case 'k':
      case 'l':
      case 'o':
      case 'q':
      case 'r':
      case 't':
      case 'u':
      case 'w':
      case 'x':
      case 'y':
        goto switchD_001618cc_caseD_45;
      case 'm':
        cVar1 = *pcVar8;
        bVar3 = parseRegisterTable(this_00,parser,&vars->rm,armRegisters,0x13);
        uVar5 = cVar1 == '1' ^ 0xf;
        uVar2 = (vars->rm).num;
        bVar11 = SBORROW4(uVar2,uVar5);
        bVar10 = (int)(uVar2 - uVar5) < 0;
        bVar9 = uVar2 == uVar5;
        break;
      case 'n':
        cVar1 = *pcVar8;
        bVar3 = parseRegisterTable(this_00,parser,&vars->rn,armRegisters,0x13);
        uVar5 = cVar1 == '1' ^ 0xf;
        uVar2 = (vars->rn).num;
        bVar11 = SBORROW4(uVar2,uVar5);
        bVar10 = (int)(uVar2 - uVar5) < 0;
        bVar9 = uVar2 == uVar5;
        break;
      case 'p':
        parsePsr(this_00,parser,&vars->psr);
        goto LAB_00161b9e;
      case 's':
        cVar1 = *pcVar8;
        bVar3 = parseRegisterTable(this_00,parser,&vars->rs,armRegisters,0x13);
        uVar5 = cVar1 == '1' ^ 0xf;
        uVar2 = (vars->rs).num;
        bVar11 = SBORROW4(uVar2,uVar5);
        bVar10 = (int)(uVar2 - uVar5) < 0;
        bVar9 = uVar2 == uVar5;
        break;
      case 'v':
        parseSign(this_00,parser,&vars->SignPlus);
        goto LAB_00161b9e;
      case 'z':
        this_00 = this;
        bVar3 = parsePseudoShift(this,parser,vars,(int)*pcVar8);
        goto joined_r0x00161b99;
      default:
        if (symbol == 'd') {
          cVar1 = *pcVar8;
          bVar3 = parseRegisterTable(this_00,parser,&vars->rd,armRegisters,0x13);
          uVar5 = cVar1 == '1' ^ 0xf;
          uVar2 = (vars->rd).num;
          bVar11 = SBORROW4(uVar2,uVar5);
          bVar10 = (int)(uVar2 - uVar5) < 0;
          bVar9 = uVar2 == uVar5;
          break;
        }
        goto switchD_001618cc_caseD_45;
      }
      bVar3 = (bool)(bVar3 & (bVar9 || bVar11 != bVar10));
joined_r0x00161b99:
      if (bVar3 != false) {
LAB_00161b9b:
        pcVar8 = pcVar6 + uVar7 + 2;
        goto LAB_00161b9e;
      }
      bVar3 = false;
      pcVar6 = pcVar6 + uVar7 + 2;
      goto LAB_00161ba3;
    }
LAB_00161a38:
    if (bVar3 == false) {
LAB_00161a40:
      bVar3 = false;
      pcVar6 = pcVar8;
    }
    else {
LAB_00161b9e:
      bVar3 = true;
      pcVar6 = pcVar8;
    }
LAB_00161ba3:
    if (!bVar3) {
      return false;
    }
  } while( true );
switchD_001618cc_caseD_45:
  bVar3 = matchSymbol(this_00,parser,symbol,cVar1 == '/');
  goto LAB_00161a38;
}

Assistant:

bool ArmParser::parseArmParameters(Parser& parser, const tArmOpcode& opcode, ArmOpcodeVariables& vars)
{
	const char* encoding = opcode.mask;

	ArmRegisterValue tempRegister;
	
	vars.Shift.UseShift = false;
	vars.Shift.UseFinal = false;
	vars.psr = false;
	vars.writeback = false;
	vars.SignPlus = false;
	vars.Opcode.UseNewEncoding = false;
	vars.Opcode.UseNewType = false;

	while (*encoding != 0)
	{
		bool optional = *encoding == '/';
		if (optional)
			encoding++;

		switch (*encoding++)
		{
		case 'd': // register
			CHECK(parseRegister(parser,vars.rd,*encoding++ == '1' ? 14 : 15));
			break;
		case 's': // register
			CHECK(parseRegister(parser,vars.rs,*encoding++ == '1' ? 14 : 15));
			break;
		case 'n': // register
			CHECK(parseRegister(parser,vars.rn,*encoding++ == '1' ? 14 : 15));
			break;
		case 'm': // register
			CHECK(parseRegister(parser,vars.rm,*encoding++ == '1' ? 14 : 15));
			break;
		case 'D': // cop register
			CHECK(parseCopRegister(parser,vars.CopData.cd));
			break;
		case 'N': // cop register
			CHECK(parseCopRegister(parser,vars.CopData.cn));
			break;
		case 'M': // cop register
			CHECK(parseCopRegister(parser,vars.CopData.cm));
			break;
		case 'W':	// writeback
			parseWriteback(parser,vars.writeback);
			break;
		case 'p':	// psr
			parsePsr(parser,vars.psr);
			break;
		case 'P':	// msr/mrs psr data
			CHECK(parsePsrTransfer(parser,vars,*encoding++ == '1'));
			break;
		case 'R':	// register list
			CHECK(parseRegisterList(parser,vars.rlist,0xFFFF));
			break;
		case 'S':	// shift
			CHECK(parseShift(parser,vars,*encoding++ == '1'));
			break;
		case 'I':	// immediate
		case 'i':
			CHECK(parseImmediate(parser,vars.ImmediateExpression));
			vars.ImmediateBitLen = 32;
			break;
		case 'j':	// variable bit immediate
			CHECK(parseImmediate(parser,vars.ImmediateExpression));
			vars.ImmediateBitLen = *encoding++;
			break;
		case 'X': // cop number
			CHECK(parseCopNumber(parser,vars.CopData.pn));
			break;
		case 'Y':	// cop opcode number
			CHECK(parseImmediate(parser,vars.CopData.CpopExpression));
			vars.ImmediateBitLen = 4;
			break;
		case 'Z':	// cop info number
			CHECK(parseImmediate(parser,vars.CopData.CpinfExpression));
			vars.ImmediateBitLen = 3;
			break;
		case 'z':	// shift for pseudo opcodes
			CHECK(parsePseudoShift(parser,vars,*encoding++));
			break;
		case 'v':	// sign for register index parameter
			parseSign(parser,vars.SignPlus);
			break;
		default:
			CHECK(matchSymbol(parser,*(encoding-1),optional));
			break;
		}
	}

	// the next token has to be a separator, else the parameters aren't
	// completely parsed
	return parser.nextToken().type == TokenType::Separator;
}